

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_sah_builder.h
# Opt level: O3

optional<unsigned_long> __thiscall
bvh::v2::SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::try_split
          (SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,BBox *bbox,size_t begin,
          size_t end)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  byte bVar3;
  float fVar4;
  float fVar5;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer puVar6;
  undefined8 uVar7;
  size_t axis;
  size_t axis_00;
  ulong uVar8;
  Config *pCVar9;
  size_t i;
  _Storage<unsigned_long,_true> _Var10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar11;
  size_t axis_1;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM4 [16];
  optional<unsigned_long> oVar15;
  Split best_split;
  _Storage<unsigned_long,_true> local_68;
  float local_60;
  ulong local_58;
  BBox *local_50;
  ulong local_48;
  undefined8 local_40 [2];
  
  pCVar9 = (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
  local_48 = end - begin;
  axis_00 = 0;
  fVar4 = (bbox->max).values[0] - (bbox->min).values[0];
  fVar5 = (bbox->max).values[1] - (bbox->min).values[1];
  _Var10._M_value = begin + 1 + end >> 1;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),
                            ZEXT416((uint)((bbox->max).values[2] - (bbox->min).values[2])),
                            ZEXT416((uint)(fVar4 + fVar5)));
  auVar13 = vcvtusi2ss_avx512f(in_XMM4,(pCVar9->sah).prim_offset_ + local_48 >>
                                       ((ulong)(byte)(pCVar9->sah).log_cluster_size_ & 0x3f));
  fVar4 = auVar14._0_4_ * (auVar13._0_4_ - (pCVar9->sah).cost_ratio_);
  local_58 = 0;
  local_68._M_value = _Var10._M_value;
  local_60 = fVar4;
  local_50 = bbox;
  do {
    find_best_split(this,axis_00,begin,end,(Split *)&local_68);
    axis_00 = axis_00 + 1;
  } while (axis_00 != 3);
  if (fVar4 <= local_60) {
    local_68 = (_Storage<unsigned_long,_true>)
               (this->super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>).config_;
    if (local_48 <= *(size_t *)(local_68._M_value + 0x20)) {
      uVar7 = 0;
      goto LAB_00104d0f;
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(local_50->min).values;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(local_50->max).values;
    auVar14 = vsubps_avx(auVar14,auVar13);
    auVar13 = vmovshdup_avx(auVar14);
    local_40[0] = vmovlps_avx(auVar14);
    uVar12 = (ulong)(auVar14._0_4_ < auVar13._0_4_);
    local_68._M_value = _Var10._M_value;
    local_58 = 2;
    if ((local_50->max).values[2] - (local_50->min).values[2] <=
        *(float *)((long)local_40 + uVar12 * 4)) {
      local_58 = uVar12;
    }
  }
  puVar6 = extraout_RDX;
  if (begin < local_68._M_value) {
    puVar6 = this->prim_ids_[local_58].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var2 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    pCVar9 = (Config *)begin;
    do {
      uVar12 = puVar6[(long)pCVar9];
      uVar8 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar8 = uVar12;
      }
      pCVar9 = (Config *)((long)&(pCVar9->sah).log_cluster_size_ + 1);
      puVar1 = p_Var2 + ((long)uVar8 >> 6) +
                        (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << (uVar12 & 0x3f);
    } while ((Config *)local_68._M_value != pCVar9);
  }
  if (local_68._M_value < end) {
    puVar6 = this->prim_ids_[local_58].
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var2 = (this->marks_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    _Var10 = local_68;
    do {
      uVar12 = puVar6[(long)_Var10];
      uVar8 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar8 = uVar12;
      }
      bVar3 = (byte)uVar12 & 0x3f;
      _Var10._M_value = _Var10._M_value + 1;
      puVar1 = p_Var2 + ((long)uVar8 >> 6) +
                        (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    } while (end != _Var10._M_value);
  }
  pvVar11 = this->prim_ids_;
  uVar12 = 0;
  do {
    if (uVar12 != local_58) {
      puVar6 = (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::
      __stable_partition<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_pred<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::try_split(bvh::v2::BBox<float,3ul>const&,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(puVar6 + begin),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(puVar6 + end),
                 (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:135:17)>
                  )this);
      puVar6 = extraout_RDX_00;
    }
    uVar12 = uVar12 + 1;
    pvVar11 = pvVar11 + 1;
  } while (uVar12 != 3);
  uVar7 = CONCAT71((int7)((ulong)puVar6 >> 8),1);
LAB_00104d0f:
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar7;
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_68._M_value;
  return (optional<unsigned_long>)
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> try_split(const BBox& bbox, size_t begin, size_t end) override {
        // Find the best split over all axes
        auto leaf_cost = config_.sah.get_non_split_cost(begin, end, bbox);
        auto best_split = Split { (begin + end + 1) / 2, leaf_cost, 0 };
        for (size_t axis = 0; axis < Node::dimension; ++axis)
            find_best_split(axis, begin, end, best_split);

        // Make sure that the split is good before proceeding with it
        if (best_split.cost >= leaf_cost) {
            if (end - begin <= config_.max_leaf_size)
                return std::nullopt;

            // If the number of primitives is too high, fallback on a split at the
            // median on the largest axis.
            best_split.pos = (begin + end + 1) / 2;
            best_split.axis = bbox.get_diagonal().get_largest_axis();
        }

        // Partition primitives (keeping the order intact so that the next recursive calls do not
        // need to sort primitives again).
        mark_primitives(best_split.axis, begin, best_split.pos, end);
        for (size_t axis = 0; axis < Node::dimension; ++axis) {
            if (axis == best_split.axis)
                continue;
            std::stable_partition(
                prim_ids_[axis].begin() + begin,
                prim_ids_[axis].begin() + end,
                [&] (size_t i) { return marks_[i]; });
        }

        return std::make_optional(best_split.pos);
    }